

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::TextV(char *fmt,__va_list_tag *args)

{
  char *local_30;
  char *text_end;
  char *text;
  ImGuiWindow *window;
  __va_list_tag *args_local;
  char *fmt_local;
  
  window = (ImGuiWindow *)args;
  args_local = (__va_list_tag *)fmt;
  text = (char *)GetCurrentWindow();
  if ((((ImGuiWindow *)text)->SkipItems & 1U) == 0) {
    ImFormatStringToTempBufferV(&text_end,&local_30,(char *)args_local,(__va_list_tag *)window);
    TextEx(text_end,local_30,1);
  }
  return;
}

Assistant:

void ImGui::TextV(const char* fmt, va_list args)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return;

    // FIXME-OPT: Handle the %s shortcut?
    const char* text, *text_end;
    ImFormatStringToTempBufferV(&text, &text_end, fmt, args);
    TextEx(text, text_end, ImGuiTextFlags_NoWidthForLargeClippedText);
}